

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_set_standard_lookup.c
# Opt level: O0

int64_t lookup_gid(void *private_data,char *gname,int64_t gid)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  group *pgStack_108;
  int r;
  group *result;
  group grent;
  char *allocated;
  char *buffer;
  size_t bufsize;
  char _buffer [128];
  bucket *gcache;
  bucket *b;
  void *pvStack_28;
  int h;
  int64_t gid_local;
  char *gname_local;
  void *private_data_local;
  
  private_data_local = (void *)gid;
  if ((gname != (char *)0x0) && (*gname != '\0')) {
    uVar1 = hash(gname);
    plVar3 = (long *)((long)private_data + ((ulong)(long)(int)uVar1 % 0x7f) * 0x10);
    if ((*plVar3 == 0) ||
       ((*(uint *)(plVar3 + 1) != uVar1 || (iVar2 = strcmp(gname,(char *)*plVar3), iVar2 != 0)))) {
      free((void *)*plVar3);
      pcVar4 = strdup(gname);
      *plVar3 = (long)pcVar4;
      *(uint *)(plVar3 + 1) = uVar1;
      buffer = (char *)0x80;
      allocated = (char *)&bufsize;
      grent.gr_mem = (char **)0x0;
      do {
        pgStack_108 = (group *)&result;
        iVar2 = getgrnam_r(gname,(group *)&result,allocated,(size_t)buffer,&stack0xfffffffffffffef8)
        ;
        if ((iVar2 == 0) || (iVar2 != 0x22)) break;
        buffer = (char *)((long)buffer << 1);
        free(grent.gr_mem);
        grent.gr_mem = (char **)malloc((size_t)buffer);
        allocated = (char *)grent.gr_mem;
      } while (grent.gr_mem != (char **)0x0);
      pvStack_28 = (void *)gid;
      if (pgStack_108 != (group *)0x0) {
        pvStack_28 = (void *)(ulong)pgStack_108->gr_gid;
      }
      free(grent.gr_mem);
      *(int *)((long)plVar3 + 0xc) = (int)pvStack_28;
      private_data_local = pvStack_28;
    }
    else {
      private_data_local = (void *)(ulong)*(uint *)((long)plVar3 + 0xc);
    }
  }
  return (int64_t)private_data_local;
}

Assistant:

static int64_t
lookup_gid(void *private_data, const char *gname, int64_t gid)
{
	int h;
	struct bucket *b;
	struct bucket *gcache = (struct bucket *)private_data;

	/* If no gname, just use the gid provided. */
	if (gname == NULL || *gname == '\0')
		return (gid);

	/* Try to find gname in the cache. */
	h = hash(gname);
	b = &gcache[h % cache_size ];
	if (b->name != NULL && b->hash == h && strcmp(gname, b->name) == 0)
		return ((gid_t)b->id);

	/* Free the cache slot for a new entry. */
	free(b->name);
	b->name = strdup(gname);
	/* Note: If strdup fails, that's okay; we just won't cache. */
	b->hash = h;
#if HAVE_GRP_H
#  if HAVE_GETGRNAM_R
	{
		char _buffer[128];
		size_t bufsize = 128;
		char *buffer = _buffer;
		char *allocated = NULL;
		struct group	grent, *result;
		int r;

		for (;;) {
			result = &grent; /* Old getgrnam_r ignores last arg. */
			r = getgrnam_r(gname, &grent, buffer, bufsize, &result);
			if (r == 0)
				break;
			if (r != ERANGE)
				break;
			bufsize *= 2;
			free(allocated);
			allocated = malloc(bufsize);
			if (allocated == NULL)
				break;
			buffer = allocated;
		}
		if (result != NULL)
			gid = result->gr_gid;
		free(allocated);
	}
#  else /* HAVE_GETGRNAM_R */
	{
		struct group *result;

		result = getgrnam(gname);
		if (result != NULL)
			gid = result->gr_gid;
	}
#  endif /* HAVE_GETGRNAM_R */
#elif defined(_WIN32) && !defined(__CYGWIN__)
	/* TODO: do a gname->gid lookup for Windows. */
#else
	#error No way to perform gid lookups on this platform
#endif
	b->id = (gid_t)gid;

	return (gid);
}